

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double fisk_variance(double param_1,double b,double c)

{
  double theta;
  double dVar1;
  double dVar2;
  __type _Var3;
  double variance;
  double r8_pi;
  double g;
  double c_local;
  double b_local;
  double param_0_local;
  
  if (c <= 2.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"FISK_VARIANCE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  No variance defined for C <= 2.0\n");
    exit(1);
  }
  theta = 3.141592653589793 / c;
  dVar1 = r8_csc(theta * 2.0);
  dVar2 = r8_csc(theta);
  _Var3 = std::pow<double,int>(theta * dVar2,2);
  return b * b * (theta * 2.0 * dVar1 + -_Var3);
}

Assistant:

double fisk_variance ( double  /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_VARIANCE returns the variance of the Fisk PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, double FISK_VARIANCE, the variance of the PDF.
//
{
  double g;
  const double r8_pi = 3.14159265358979323;
  double variance;

  if ( c <= 2.0 )
  {
    cerr << " \n";
    cerr << "FISK_VARIANCE - Fatal error!\n";
    cerr << "  No variance defined for C <= 2.0\n";
    exit ( 1 );
  }

  g = r8_pi / c;

  variance = b * b * ( 2.0 * g * r8_csc ( 2.0 * g ) 
    - pow ( ( g * r8_csc ( g ) ), 2 ) );

  return variance;
}